

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS ref_phys_signed_distance(REF_GRID ref_grid,REF_DBL *field,REF_DBL *distance)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *pRVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  REF_STATUS RVar4;
  uint uVar5;
  int iVar6;
  void *__ptr;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar20;
  double dVar21;
  REF_DBL gradient [3];
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  lVar11 = (long)ref_node->max;
  if (lVar11 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x589,
           "ref_phys_signed_distance","malloc set of REF_INT negative");
    RVar4 = 1;
  }
  else {
    ref_cell = ref_grid->cell[3];
    __ptr = malloc(lVar11 * 4);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x589,
             "ref_phys_signed_distance","malloc set of REF_INT NULL");
      RVar4 = 2;
    }
    else {
      for (lVar7 = 0; lVar11 != lVar7; lVar7 = lVar7 + 1) {
        *(undefined4 *)((long)__ptr + lVar7 * 4) = 0;
      }
      for (iVar10 = 0; iVar6 = ref_cell->max, iVar10 < iVar6; iVar10 = iVar10 + 1) {
        RVar4 = ref_cell_nodes(ref_cell,iVar10,nodes);
        if (RVar4 == 0) {
          dVar16 = field[nodes[0]];
          dVar14 = field[nodes[1]];
          dVar19 = dVar16;
          if (dVar14 <= dVar16) {
            dVar19 = dVar14;
          }
          dVar20 = field[nodes[2]];
          if (dVar20 <= dVar19) {
            dVar19 = dVar20;
          }
          if (dVar19 <= 0.0) {
            if (dVar16 <= dVar14) {
              dVar16 = dVar14;
            }
            if (dVar16 <= dVar20) {
              dVar16 = dVar20;
            }
            if (0.0 <= dVar16) {
              uVar5 = ref_node_tri_grad_nodes(ref_node,nodes,field,gradient);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x58f,"ref_phys_signed_distance",(ulong)uVar5,"grad");
                return uVar5;
              }
              dVar14 = SQRT(gradient[2] * gradient[2] +
                            gradient[0] * gradient[0] + gradient[1] * gradient[1]);
              dVar16 = dVar14 * 1e+20;
              if (dVar16 <= -dVar16) {
                dVar16 = -dVar16;
              }
              uVar8 = (ulong)(uint)ref_cell->node_per;
              if (ref_cell->node_per < 1) {
                uVar8 = 0;
              }
              for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
                lVar11 = (long)nodes[uVar9];
                dVar19 = field[lVar11];
                dVar20 = dVar19;
                if (dVar19 <= -dVar19) {
                  dVar20 = -dVar19;
                }
                distance[lVar11] = (REF_DBL)(-(ulong)(dVar20 < dVar16) & (ulong)(dVar19 / dVar14));
                *(undefined4 *)((long)__ptr + lVar11 * 4) = 1;
              }
            }
          }
        }
      }
      bVar3 = true;
      while (bVar3) {
        bVar3 = false;
        for (iVar10 = 0; iVar10 < iVar6; iVar10 = iVar10 + 1) {
          RVar4 = ref_cell_nodes(ref_cell,iVar10,nodes);
          if ((RVar4 == 0) &&
             (*(int *)((long)__ptr + (long)nodes[1] * 4) +
              *(int *)((long)__ptr + (long)nodes[0] * 4) +
              *(int *)((long)__ptr + (long)nodes[2] * 4) == 2)) {
            uVar8 = (ulong)(uint)ref_cell->node_per;
            if (ref_cell->node_per < 1) {
              uVar8 = 0;
            }
            for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
              lVar11 = (long)nodes[uVar9];
              if (*(int *)((long)__ptr + lVar11 * 4) == 0) {
                pRVar1 = ref_node->real;
                lVar12 = (long)nodes[(int)((uint)(uVar9 < 2) * 3 + (int)uVar9 + -2)];
                lVar13 = (long)(nodes[uVar9] * 0xf);
                dVar16 = pRVar1[lVar12 * 0xf] - pRVar1[lVar13];
                dVar14 = pRVar1[lVar12 * 0xf + 2] - pRVar1[lVar13 + 2];
                auVar15._0_8_ = dVar16 * dVar16;
                auVar15._8_8_ = dVar14 * dVar14;
                lVar7 = uVar9 - 1;
                if (uVar9 == 0) {
                  lVar7 = 2;
                }
                lVar7 = (long)nodes[lVar7];
                dVar20 = pRVar1[lVar7 * 0xf] - pRVar1[lVar13];
                dVar21 = pRVar1[lVar7 * 0xf + 2] - pRVar1[lVar13 + 2];
                dVar16 = distance[lVar7];
                dVar14 = pRVar1[lVar12 * 0xf + 1] - pRVar1[lVar13 + 1];
                dVar19 = pRVar1[lVar7 * 0xf + 1] - pRVar1[lVar13 + 1];
                auVar2._8_8_ = dVar21 * dVar21 + dVar20 * dVar20 + dVar19 * dVar19;
                auVar2._0_8_ = auVar15._8_8_ + auVar15._0_8_ + dVar14 * dVar14;
                auVar15 = sqrtpd(auVar15,auVar2);
                auVar17._8_8_ = dVar16;
                auVar17._0_8_ = distance[lVar12];
                auVar18._8_8_ = -dVar16;
                auVar18._0_8_ = -distance[lVar12];
                auVar18 = maxpd(auVar17,auVar18);
                dVar14 = auVar18._0_8_ + auVar15._0_8_;
                dVar19 = auVar18._8_8_ + auVar15._8_8_;
                if (dVar19 <= dVar14) {
                  dVar14 = dVar19;
                }
                distance[lVar11] =
                     (REF_DBL)((ulong)-dVar14 & -(ulong)(dVar16 < 0.0) |
                              ~-(ulong)(dVar16 < 0.0) & (ulong)dVar14);
                *(undefined4 *)((long)__ptr + lVar11 * 4) = 1;
                bVar3 = true;
              }
            }
          }
          iVar6 = ref_cell->max;
        }
      }
      free(__ptr);
      RVar4 = 0;
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_phys_signed_distance(REF_GRID ref_grid, REF_DBL *field,
                                            REF_DBL *distance) {
  REF_DBL node_min, node_max;
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL gradient[3], slope, dist, len;
  REF_INT cell_node, cell, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *set;
  REF_BOOL update;
  REF_INT passes;
  ref_malloc_init(set, ref_node_max(ref_node), REF_INT, 0);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    node_min = MIN(MIN(field[nodes[0]], field[nodes[1]]), field[nodes[2]]);
    node_max = MAX(MAX(field[nodes[0]], field[nodes[1]]), field[nodes[2]]);
    if (node_min <= 0.0 && 0.0 <= node_max) {
      RSS(ref_node_tri_grad_nodes(ref_node, nodes, field, gradient), "grad");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        slope = sqrt(gradient[0] * gradient[0] + gradient[1] * gradient[1] +
                     gradient[2] * gradient[2]);
        if (ref_math_divisible(field[nodes[cell_node]], slope)) {
          distance[nodes[cell_node]] = field[nodes[cell_node]] / slope;
        } else {
          distance[nodes[cell_node]] = 0.0;
        }
        set[nodes[cell_node]] = 1;
      }
    }
  }

  update = REF_TRUE;
  passes = 0;
  while (update) {
    update = REF_FALSE;
    passes++;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (2 == set[nodes[0]] + set[nodes[1]] + set[nodes[2]]) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          if (0 == set[nodes[cell_node]]) {
            dist = 0;
            node = cell_node + 1;
            if (2 < node) node -= 3;
            len = sqrt(pow(ref_node_xyz(ref_node, 0, nodes[node]) -
                               ref_node_xyz(ref_node, 0, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 1, nodes[node]) -
                               ref_node_xyz(ref_node, 1, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 2, nodes[node]) -
                               ref_node_xyz(ref_node, 2, nodes[cell_node]),
                           2));
            dist = ABS(distance[nodes[node]]) + len;
            node = cell_node + 2;
            if (2 < node) node -= 3;
            len = sqrt(pow(ref_node_xyz(ref_node, 0, nodes[node]) -
                               ref_node_xyz(ref_node, 0, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 1, nodes[node]) -
                               ref_node_xyz(ref_node, 1, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 2, nodes[node]) -
                               ref_node_xyz(ref_node, 2, nodes[cell_node]),
                           2));

            dist = MIN(dist, ABS(distance[nodes[node]]) + len);
            if (distance[nodes[node]] >= 0.0) {
              distance[nodes[cell_node]] = dist;
            } else {
              distance[nodes[cell_node]] = -dist;
            }
            set[nodes[cell_node]] = 1;
            update = REF_TRUE;
          }
        }
      }
    }
  }

  ref_free(set);
  return REF_SUCCESS;
}